

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

double __thiscall
mp::internal::BinaryReader<mp::internal::EndiannessConverter>::ReadDouble
          (BinaryReader<mp::internal::EndiannessConverter> *this)

{
  undefined1 uVar1;
  double *pdVar2;
  undefined1 *puVar3;
  long lVar4;
  undefined8 local_8;
  
  (this->super_BinaryReaderBase).super_ReaderBase.token_ =
       (this->super_BinaryReaderBase).super_ReaderBase.ptr_;
  pdVar2 = (double *)BinaryReaderBase::Read(&this->super_BinaryReaderBase,8);
  puVar3 = (undefined1 *)((long)&local_8 + 7);
  local_8 = *pdVar2;
  lVar4 = 0;
  do {
    uVar1 = *(undefined1 *)((long)&local_8 + lVar4);
    *(undefined1 *)((long)&local_8 + lVar4) = *puVar3;
    *puVar3 = uVar1;
    lVar4 = lVar4 + 1;
    puVar3 = puVar3 + -1;
  } while (lVar4 != 4);
  return local_8;
}

Assistant:

double ReadDouble() {
    token_ = ptr_;
    double val;
    memcpy(&val, Read(sizeof(double)), sizeof(double));
    return this->Convert(val);
  }